

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O1

void __thiscall sentencepiece::SentencePieceText::Clear(SentencePieceText *this)

{
  void *pvVar1;
  undefined8 *puVar2;
  ulong uVar3;
  
  google::protobuf::internal::ExtensionSet::Clear(&this->_extensions_);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<sentencepiece::SentencePieceText_SentencePiece>::TypeHandler>
            (&(this->pieces_).super_RepeatedPtrFieldBase);
  if (((this->_has_bits_).has_bits_[0] & 1) != 0) {
    puVar2 = (undefined8 *)((ulong)(this->text_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    puVar2[1] = 0;
    *(undefined1 *)*puVar2 = 0;
  }
  this->score_ = 0.0;
  (this->_has_bits_).has_bits_[0] = 0;
  pvVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    uVar3 = (ulong)pvVar1 & 0xfffffffffffffffe;
    *(undefined8 *)(uVar3 + 0x10) = 0;
    **(undefined1 **)(uVar3 + 8) = 0;
  }
  return;
}

Assistant:

void SentencePieceText::Clear() {
// @@protoc_insertion_point(message_clear_start:sentencepiece.SentencePieceText)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _extensions_.Clear();
  pieces_.Clear();
  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000001u) {
    text_.ClearNonDefaultToEmpty();
  }
  score_ = 0;
  _has_bits_.Clear();
  _internal_metadata_.Clear<std::string>();
}